

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::getFilterTypesInterlaced
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *filterTypes,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  uint w_00;
  uchar *puVar6;
  size_t sVar7;
  size_t j;
  uchar *puVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  allocator<char> local_2a1;
  uint w;
  uint h;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_298;
  uchar *local_290;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zdata;
  char type [5];
  State state;
  
  State::State((State *)&state.super_LodePNGState);
  puVar9 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_298 = png;
  uVar5 = lodepng_inspect(&w,&h,&state.super_LodePNGState,puVar9,
                          (long)(png->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar9);
  if (uVar5 == 0) {
    local_290 = (local_298->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    puVar8 = (local_298->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 8;
    zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar9 = puVar8;
    do {
      if ((local_290 <= puVar9 + 8) || (puVar9 < puVar8)) break;
      lodepng_chunk_type(type,puVar9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&data,type,&local_2a1);
      puVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      std::__cxx11::string::~string((string *)&data);
      if (puVar3 != (pointer)0x4) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&data,type,&local_2a1);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &data,"IDAT");
      std::__cxx11::string::~string((string *)&data);
      if (bVar4) {
        puVar6 = lodepng_chunk_data_const(puVar9);
        uVar5 = lodepng_chunk_length(puVar9);
        uVar11 = (ulong)uVar5;
        if ((local_290 < puVar9 + uVar11 + 0xc) ||
           ((ulong)((long)(local_298->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(local_298->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start) < uVar11)) {
          uVar5 = 1;
          goto LAB_00119378;
        }
        while (bVar4 = uVar11 != 0, uVar11 = uVar11 - 1, bVar4) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&zdata,puVar6);
          puVar6 = puVar6 + 1;
        }
      }
      puVar6 = lodepng_chunk_next_const(puVar9);
      bVar4 = puVar9 < puVar6;
      puVar9 = puVar6;
    } while (bVar4);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar5 = decompress(&data,zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                       (long)zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                       &lodepng_default_decompress_settings);
    if (uVar5 == 0) {
      if (state.super_LodePNGState.info_png.interlace_method == 0) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(filterTypes,1);
        sVar7 = lodepng_get_raw_size(w,1,&state.super_LodePNGState.info_png.color);
        uVar5 = 0;
        for (uVar11 = 0;
            uVar11 < (ulong)((long)data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            uVar11 = uVar11 + sVar7 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((filterTypes->
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar11);
        }
      }
      else {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(filterTypes,7);
        lVar12 = 0;
        for (lVar10 = 0; uVar2 = h, uVar5 = 0, lVar10 != 7; lVar10 = lVar10 + 1) {
          w_00 = (~getFilterTypesInterlaced::ADAM7_IX[lVar10] + w +
                 getFilterTypesInterlaced::ADAM7_DX[lVar10]) /
                 getFilterTypesInterlaced::ADAM7_DX[lVar10];
          uVar5 = getFilterTypesInterlaced::ADAM7_IY[lVar10];
          uVar1 = getFilterTypesInterlaced::ADAM7_DY[lVar10];
          if (w <= getFilterTypesInterlaced::ADAM7_IX[lVar10]) {
            w_00 = 0;
          }
          sVar7 = lodepng_get_raw_size(w_00,1,&state.super_LodePNGState.info_png.color);
          uVar11 = (ulong)(~uVar5 + uVar2 + uVar1) / (ulong)uVar1;
          if (uVar2 <= uVar5) {
            uVar11 = 0;
          }
          while (bVar4 = uVar11 != 0, uVar11 = uVar11 - 1, bVar4) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((filterTypes->
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar10,
                       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar12);
            lVar12 = lVar12 + sVar7 + 1;
          }
        }
      }
    }
    else {
      uVar5 = 1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00119378:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&zdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    uVar5 = 1;
  }
  State::~State(&state);
  return uVar5;
}

Assistant:

unsigned getFilterTypesInterlaced(std::vector<std::vector<unsigned char> >& filterTypes,
                                  const std::vector<unsigned char>& png) {
  //Get color type and interlace type
  lodepng::State state;
  unsigned w, h;
  unsigned error;
  error = lodepng_inspect(&w, &h, &state, &png[0], png.size());

  if(error) return 1;

  //Read literal data from all IDAT chunks
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  std::vector<unsigned char> zdata;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) break; //Probably not a PNG file

    if(std::string(type) == "IDAT") {
      const unsigned char* cdata = lodepng_chunk_data_const(chunk);
      unsigned clength = lodepng_chunk_length(chunk);
      if(chunk + clength + 12 > end || clength > png.size() || chunk + clength + 12 < begin) {
        // corrupt chunk length
        return 1;
      }

      for(unsigned i = 0; i < clength; i++) {
        zdata.push_back(cdata[i]);
      }
    }

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) break; // integer overflow
    chunk = next;
  }

  //Decompress all IDAT data (if the while loop ended early, this might fail)
  std::vector<unsigned char> data;
  error = lodepng::decompress(data, &zdata[0], zdata.size());

  if(error) return 1;

  if(state.info_png.interlace_method == 0) {
    filterTypes.resize(1);

    //A line is 1 filter byte + all pixels
    size_t linebytes = 1 + lodepng_get_raw_size(w, 1, &state.info_png.color);

    for(size_t i = 0; i < data.size(); i += linebytes) {
      filterTypes[0].push_back(data[i]);
    }
  } else {
    //Interlaced
    filterTypes.resize(7);
    static const unsigned ADAM7_IX[7] = { 0, 4, 0, 2, 0, 1, 0 }; /*x start values*/
    static const unsigned ADAM7_IY[7] = { 0, 0, 4, 0, 2, 0, 1 }; /*y start values*/
    static const unsigned ADAM7_DX[7] = { 8, 8, 4, 4, 2, 2, 1 }; /*x delta values*/
    static const unsigned ADAM7_DY[7] = { 8, 8, 8, 4, 4, 2, 2 }; /*y delta values*/
    size_t pos = 0;
    for(size_t j = 0; j < 7; j++) {
      unsigned w2 = (w - ADAM7_IX[j] + ADAM7_DX[j] - 1) / ADAM7_DX[j];
      unsigned h2 = (h - ADAM7_IY[j] + ADAM7_DY[j] - 1) / ADAM7_DY[j];
      if(ADAM7_IX[j] >= w) w2 = 0;
      if(ADAM7_IY[j] >= h) h2 = 0;
      size_t linebytes = 1 + lodepng_get_raw_size(w2, 1, &state.info_png.color);
      for(size_t i = 0; i < h2; i++) {
        filterTypes[j].push_back(data[pos]);
        pos += linebytes;
      }
    }
  }
  return 0; /* OK */
}